

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenBoundingBoxesProcess.cpp
# Opt level: O0

void __thiscall
utGenBoundingBoxesProcess_executeTest_Test::~utGenBoundingBoxesProcess_executeTest_Test
          (utGenBoundingBoxesProcess_executeTest_Test *this)

{
  utGenBoundingBoxesProcess_executeTest_Test *this_local;
  
  ~utGenBoundingBoxesProcess_executeTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utGenBoundingBoxesProcess, executeTest) {
    mProcess->Execute(mScene);

    aiMesh* mesh = mScene->mMeshes[0];
    EXPECT_NE(nullptr, mesh);
    EXPECT_EQ(0, mesh->mAABB.mMin.x);
    EXPECT_EQ(0, mesh->mAABB.mMin.y);
    EXPECT_EQ(0, mesh->mAABB.mMin.z);

    EXPECT_EQ(99, mesh->mAABB.mMax.x);
    EXPECT_EQ(99, mesh->mAABB.mMax.y);
    EXPECT_EQ(99, mesh->mAABB.mMax.z);
}